

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O2

Type __thiscall Parse::toType(Parse *this,string *basic_string)

{
  bool bVar1;
  Type TVar2;
  
  bVar1 = std::operator==(basic_string,"int");
  if (bVar1) {
    TVar2 = INT;
  }
  else {
    bVar1 = std::operator==(basic_string,"bool");
    if (bVar1) {
      TVar2 = BOOL;
    }
    else {
      bVar1 = std::operator==(basic_string,"float");
      TVar2 = DOUBLE;
      if ((!bVar1) && (bVar1 = std::operator==(basic_string,"double"), !bVar1)) {
        bVar1 = std::operator==(basic_string,"char");
        if (bVar1) {
          TVar2 = CHAR;
        }
        else {
          bVar1 = std::operator==(basic_string,"arr");
          if (bVar1) {
            TVar2 = ARRAY;
          }
          else {
            bVar1 = std::operator==(basic_string,"string");
            if (bVar1) {
              TVar2 = STRING;
            }
            else {
              std::operator==(basic_string,"void");
              TVar2 = VOID;
            }
          }
        }
      }
    }
  }
  return TVar2;
}

Assistant:

Type Parse::toType(string basic_string) {
    if(basic_string == "int") {
        return Type::INT;
    } else if(basic_string == "bool") {
        return Type::BOOL;
    } else if(basic_string == "float" || basic_string == "double") {
        return Type ::DOUBLE;
    } else if(basic_string == "char") {
        return Type ::CHAR;
    } else if(basic_string == "arr") {
        return Type ::ARRAY;
    } else if(basic_string == "string") {
        return Type::STRING;
    } else if(basic_string == "void") {
        return Type::VOID;
    }
}